

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall
cmCursesMainForm::cmCursesMainForm
          (cmCursesMainForm *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,int initWidth)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  unique_ptr<cmake,_std::default_delete<cmake>_> *this_01;
  cmake *pcVar1;
  pointer pbVar2;
  size_t __p;
  string whereCMake;
  string local_d0;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  cmCursesForm::cmCursesForm(&this->super_cmCursesForm);
  (this->super_cmCursesForm)._vptr_cmCursesForm = (_func_int **)&PTR__cmCursesMainForm_00778bc0;
  (this->Entries).
  super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Entries).
  super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Entries).
  super__Vector_base<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LogForm)._M_t.
  super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>._M_t
  .super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>.
  super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl =
       (cmCursesLongMessageForm *)0x0;
  (this->Outputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Outputs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Outputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->Outputs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->LastProgress)._M_dataplus._M_p = (pointer)&(this->LastProgress).field_2;
  (this->LastProgress)._M_string_length = 0;
  (this->LastProgress).field_2._M_local_buf[0] = '\0';
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->Args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->Args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
  (this->Args).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->NumberOfPages = 0;
  this->IsEmpty = false;
  (this->EmptyCacheEntry)._M_t.
  super___uniq_ptr_impl<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCursesCacheEntryComposite_*,_std::default_delete<cmCursesCacheEntryComposite>_>
  .super__Head_base<0UL,_cmCursesCacheEntryComposite_*,_false>._M_head_impl =
       (cmCursesCacheEntryComposite *)0x0;
  (this->HelpMessage).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HelpMessage).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HelpMessage).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  *(undefined8 *)((long)&this->NumberOfVisibleEntries + 2) = 0;
  this->InitialWidth = initWidth;
  (this->CMakeInstance)._M_t.super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
  super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.super__Head_base<0UL,_cmake_*,_false>
  ._M_head_impl = (cmake *)0x0;
  (this->SearchString)._M_dataplus._M_p = (pointer)&(this->SearchString).field_2;
  (this->SearchString)._M_string_length = 0;
  args_00 = &this->Args;
  (this->SearchString).field_2._M_local_buf[0] = '\0';
  (this->OldSearchString)._M_dataplus._M_p = (pointer)&(this->OldSearchString).field_2;
  (this->OldSearchString)._M_string_length = 0;
  this_00 = &this->HelpMessage;
  this_01 = &this->CMakeInstance;
  (this->OldSearchString).field_2._M_local_buf[0] = '\0';
  this->SearchMode = false;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[58]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             (char (*) [58])"Welcome to ccmake, curses based user interface for CMake.");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(this_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
             &s_ConstHelpMessage);
  local_60.View_._M_len = CONCAT44(local_60.View_._M_len._4_4_,2);
  local_b0._M_dataplus._M_p._0_4_ = 1;
  std::make_unique<cmake,cmake::Role,cmState::Mode>((Role *)&local_90,(Mode *)&local_60);
  __p = local_90.View_._M_len;
  local_90.View_._M_len = 0;
  std::__uniq_ptr_impl<cmake,_std::default_delete<cmake>_>::reset
            ((__uniq_ptr_impl<cmake,_std::default_delete<cmake>_> *)this_01,(pointer)__p);
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr
            ((unique_ptr<cmake,_std::default_delete<cmake>_> *)&local_90);
  pcVar1 = (this_01->_M_t).super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  cmSystemTools::GetCMakeCursesCommand_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&pcVar1->CMakeEditCommand);
  cmsys::SystemTools::GetProgramPath
            (&local_d0,
             (args_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  local_90.View_._M_len = local_d0._M_string_length;
  local_90.View_._M_str = local_d0._M_dataplus._M_p;
  local_60.View_._M_len = 6;
  local_60.View_._M_str = "/cmake";
  cmStrCat<>(&local_b0,&local_90,&local_60);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::_M_assign
            ((string *)
             (args_00->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  cmake::SetArgs((this_01->_M_t).super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
                 super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
                 super__Head_base<0UL,_cmake_*,_false>._M_head_impl,args_00);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

cmCursesMainForm::cmCursesMainForm(std::vector<std::string> args,
                                   int initWidth)
  : Args(std::move(args))
  , InitialWidth(initWidth)
{
  this->HelpMessage.emplace_back(
    "Welcome to ccmake, curses based user interface for CMake.");
  this->HelpMessage.emplace_back();
  this->HelpMessage.emplace_back(s_ConstHelpMessage);
  this->CMakeInstance =
    cm::make_unique<cmake>(cmake::RoleProject, cmState::Project);
  this->CMakeInstance->SetCMakeEditCommand(
    cmSystemTools::GetCMakeCursesCommand());

  // create the arguments for the cmake object
  std::string whereCMake =
    cmStrCat(cmSystemTools::GetProgramPath(this->Args[0]), "/cmake");
  this->Args[0] = whereCMake;
  this->CMakeInstance->SetArgs(this->Args);
}